

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMultisetEmplaceHint_Test::
~Btree_BtreeMultisetEmplaceHint_Test(Btree_BtreeMultisetEmplaceHint_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, BtreeMultisetEmplaceHint) {
        const int value_to_insert = 123456;
        phmap::btree_multiset<int> s;
        auto iter = s.emplace(value_to_insert);
        ASSERT_NE(iter, s.end());
        EXPECT_EQ(*iter, value_to_insert);
        auto emplace_iter = s.emplace_hint(iter, value_to_insert);
        EXPECT_NE(emplace_iter, iter);
        ASSERT_NE(emplace_iter, s.end());
        EXPECT_EQ(*emplace_iter, value_to_insert);
    }